

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

void __thiscall
crnlib::command_line_params::find
          (command_line_params *this,char *pKey,param_map_const_iterator *begin,
          param_map_const_iterator *end)

{
  const_iterator cVar1;
  undefined1 local_38 [8];
  dynamic_string key;
  param_map_const_iterator *end_local;
  param_map_const_iterator *begin_local;
  char *pKey_local;
  command_line_params *this_local;
  
  key.m_pStr = (char *)end;
  dynamic_string::dynamic_string((dynamic_string *)local_38,pKey);
  cVar1 = std::
          multimap<crnlib::dynamic_string,_crnlib::command_line_params::param_value,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          ::lower_bound(&this->m_param_map,(dynamic_string *)local_38);
  begin->_M_node = cVar1._M_node;
  cVar1 = std::
          multimap<crnlib::dynamic_string,_crnlib::command_line_params::param_value,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          ::upper_bound(&this->m_param_map,(key_type *)local_38);
  *(_Base_ptr *)key.m_pStr = cVar1._M_node;
  dynamic_string::~dynamic_string((dynamic_string *)local_38);
  return;
}

Assistant:

void command_line_params::find(const char* pKey, param_map_const_iterator& begin, param_map_const_iterator& end) const
    {
        dynamic_string key(pKey);
        begin = m_param_map.lower_bound(key);
        end = m_param_map.upper_bound(key);
    }